

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  float fVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  ImDrawIdx IVar4;
  ImVec2 uv;
  
  if (0xffffff < (col_upr_right | col_upr_left | col_bot_right | col_bot_left)) {
    uv = this->_Data->TexUvWhitePixel;
    PrimReserve(this,6,4);
    pIVar2 = this->_IdxWritePtr;
    IVar4 = (ImDrawIdx)this->_VtxCurrentIdx;
    *pIVar2 = IVar4;
    pIVar2[1] = IVar4 + 1;
    pIVar2[2] = IVar4 + 2;
    pIVar2[3] = IVar4;
    pIVar2[4] = IVar4 + 2;
    pIVar2[5] = IVar4 + 3;
    this->_IdxWritePtr = pIVar2 + 6;
    PrimWriteVtx(this,p_min,&uv,col_upr_left);
    fVar1 = p_min->y;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->pos).x = p_max->x;
    (pIVar3->pos).y = fVar1;
    this->_VtxWritePtr->uv = uv;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = col_upr_right;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
    PrimWriteVtx(this,p_max,&uv,col_bot_right);
    fVar1 = p_max->y;
    pIVar3 = this->_VtxWritePtr;
    (pIVar3->pos).x = p_min->x;
    (pIVar3->pos).y = fVar1;
    this->_VtxWritePtr->uv = uv;
    pIVar3 = this->_VtxWritePtr;
    pIVar3->col = col_bot_left;
    this->_VtxWritePtr = pIVar3 + 1;
    this->_VtxCurrentIdx = this->_VtxCurrentIdx + 1;
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& p_min, const ImVec2& p_max, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) & IM_COL32_A_MASK) == 0)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+3));
    PrimWriteVtx(p_min, uv, col_upr_left);
    PrimWriteVtx(ImVec2(p_max.x, p_min.y), uv, col_upr_right);
    PrimWriteVtx(p_max, uv, col_bot_right);
    PrimWriteVtx(ImVec2(p_min.x, p_max.y), uv, col_bot_left);
}